

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::GetSimdTypesFromAsmType
          (IRBuilderAsmJs *this,Which asmType,IRType *pIRType,ValueType *pValueType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  IRType local_29;
  ValueType vType;
  IRType irType;
  ValueType *pValueType_local;
  IRType *pIRType_local;
  Which asmType_local;
  IRBuilderAsmJs *this_local;
  
  local_29 = TyVar;
  local_2c = ValueType::Uninitialized.field_0;
  switch(asmType) {
  case Int32x4:
    local_29 = TySimd128I4;
    local_2c = ValueType::Simd.field_0;
    break;
  case Uint32x4:
    local_29 = TySimd128U4;
    local_2c = ValueType::Simd.field_0;
    break;
  case Int16x8:
    local_29 = TySimd128I8;
    local_2c = ValueType::Simd.field_0;
    break;
  case Int8x16:
    local_29 = TySimd128I16;
    local_2c = ValueType::Simd.field_0;
    break;
  case Uint16x8:
    local_29 = TySimd128U8;
    local_2c = ValueType::Simd.field_0;
    break;
  case Uint8x16:
    local_29 = TySimd128U16;
    local_2c = ValueType::Simd.field_0;
    break;
  case Bool32x4:
    local_29 = TySimd128B4;
    local_2c = ValueType::Simd.field_0;
    break;
  case Bool16x8:
    local_29 = TySimd128B8;
    local_2c = ValueType::Simd.field_0;
    break;
  case Bool8x16:
    local_29 = TySimd128B16;
    local_2c = ValueType::Simd.field_0;
    break;
  case Float32x4:
    local_29 = TySimd128F4;
    local_2c = ValueType::Simd.field_0;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xe96,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *pIRType = local_29;
  if (pValueType != (ValueType *)0x0) {
    (pValueType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_2c;
  }
  return;
}

Assistant:

void IRBuilderAsmJs::GetSimdTypesFromAsmType(Js::AsmJsType::Which asmType, IRType *pIRType, ValueType *pValueType /* = nullptr */)
{
    IRType irType = IRType::TyVar;
    ValueType vType = ValueType::Uninitialized;

#define SIMD_TYPE_CHECK(type1, type2) \
case Js::AsmJsType::Which::##type1: \
        irType = type2; \
        vType = ValueType::Simd; \
        break;

    switch (asmType)
    {
        SIMD_TYPE_CHECK(Float32x4,  TySimd128F4)
        SIMD_TYPE_CHECK(Int32x4,    TySimd128I4)
        SIMD_TYPE_CHECK(Int16x8,    TySimd128I8)
        SIMD_TYPE_CHECK(Int8x16,    TySimd128I16)
        SIMD_TYPE_CHECK(Uint32x4,   TySimd128U4)
        SIMD_TYPE_CHECK(Uint16x8,   TySimd128U8)
        SIMD_TYPE_CHECK(Uint8x16,   TySimd128U16)
        SIMD_TYPE_CHECK(Bool32x4,   TySimd128B4)
        SIMD_TYPE_CHECK(Bool16x8,   TySimd128B8)
        SIMD_TYPE_CHECK(Bool8x16,   TySimd128B16)
    default:
        Assert(UNREACHED);
    }
    *pIRType = irType;
    if (pValueType)
    {
        *pValueType = vType;
    }
#undef SIMD_TYPE_CHECK
}